

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void Log::setFormat(String *lineFormat,String *timeFormat)

{
  Mutex::lock(&_Log::mutex);
  String::operator=(&_Log::lineFormat,lineFormat);
  String::operator=(&_Log::timeFormat,timeFormat);
  Mutex::unlock(&_Log::mutex);
  return;
}

Assistant:

void Log::setFormat(const String& lineFormat, const String& timeFormat)
{
  Mutex::Guard guard(_Log::mutex);
  _Log::lineFormat = lineFormat;
  _Log::timeFormat = timeFormat;
}